

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O2

void __thiscall
QtPromisePrivate::PromiseDataBase<double,_void_(const_double_&)>::~PromiseDataBase
          (PromiseDataBase<double,_void_(const_double_&)> *this)

{
  this->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_001482e0;
  std::__exception_ptr::exception_ptr::~exception_ptr(&(this->m_error).m_data);
  QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>_>
  ::~QArrayDataPointer(&(this->m_catchers).d);
  QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_double_&)>_>_>::
  ~QArrayDataPointer(&(this->m_handlers).d);
  QReadWriteLock::~QReadWriteLock(&this->m_lock);
  return;
}

Assistant:

virtual ~PromiseDataBase() { }